

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

bool __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>
::hasFastAccess(FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>
                *this)

{
  bool bVar1;
  undefined1 local_9;
  
  bVar1 = FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::hasFastAccess
                    ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)0x1eb733a);
  local_9 = false;
  if (bVar1) {
    local_9 = FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::hasFastAccess
                        ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)0x1eb7356);
  }
  return local_9;
}

Assistant:

bool hasFastAccess() const { return left_.hasFastAccess() && right_.hasFastAccess();}